

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_image_format_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,rf_uncompressed_pixel_format dst_format,
          void *dst,rf_int dst_size)

{
  rf_source_location source_location;
  int iVar1;
  int iVar2;
  undefined8 in_R9;
  long in_FS_OFFSET;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (image.valid == true) {
    if (image.format - RF_UNCOMPRESSED_GRAYSCALE < 10 && dst_format - RF_UNCOMPRESSED_GRAYSCALE < 10
       ) {
      iVar1 = rf_bits_per_pixel(image.format);
      iVar1 = iVar1 * image.height * image.width;
      iVar2 = iVar1 + 7;
      if (-1 < iVar1) {
        iVar2 = iVar1;
      }
      rf_format_pixels(image.data,(long)(iVar2 >> 3),image.format,dst,dst_size,dst_format);
      __return_storage_ptr__->data = dst;
      __return_storage_ptr__->width = image.width;
      __return_storage_ptr__->height = image.height;
      __return_storage_ptr__->format = dst_format;
      __return_storage_ptr__->valid = true;
      return __return_storage_ptr__;
    }
    source_location.proc_name._0_4_ = 0x17b1fc;
    source_location.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location.proc_name._4_4_ = 0;
    source_location.line_in_file = 0x3e92;
    rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                "Cannot format compressed pixel formats. Image format: %d, Destination format: %d.",
                1,(ulong)image.format,(ulong)dst_format,in_R9);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_image_format_to_buffer";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3e92;
  }
  else {
    rf_log_impl(8,0x17b14a,(char *)0x1);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_image_format_to_buffer";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3e94;
  }
  *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_format_to_buffer(rf_image image, rf_uncompressed_pixel_format dst_format, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (rf_is_uncompressed_format(dst_format) && rf_is_uncompressed_format(image.format))
        {
            bool success = rf_format_pixels(image.data, rf_image_size(image), image.format, dst, dst_size, dst_format);
            RF_ASSERT(success);

            result = (rf_image)
            {
                .data = dst,
                .width = image.width,
                .height = image.height,
                .format = dst_format,
                .valid = true,
            };
        }
        else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Cannot format compressed pixel formats. Image format: %d, Destination format: %d.", image.format, dst_format);
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image is invalid.");

    return result;
}